

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O2

void __thiscall efsw::Watcher::Watcher(Watcher *this)

{
  allocator<char> local_9;
  
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_0012dc80;
  this->ID = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->Directory,"",&local_9);
  this->Listener = (FileWatchListener *)0x0;
  this->Recursive = false;
  (this->OldFileName)._M_dataplus._M_p = (pointer)&(this->OldFileName).field_2;
  (this->OldFileName)._M_string_length = 0;
  (this->OldFileName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Watcher::Watcher() :
	ID(0),
	Directory(""),
	Listener(NULL),
	Recursive(false)
{
}